

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

string_t __thiscall
duckdb::SHA256Operator::Operation<duckdb::string_t,duckdb::string_t>
          (SHA256Operator *this,string_t input,Vector *result)

{
  ulong uVar1;
  long lVar2;
  char *out;
  SHA256State state;
  string_t hash;
  SHA256State local_60;
  undefined1 local_58 [16];
  string local_48;
  undefined8 local_28;
  long local_20;
  
  local_28 = this;
  local_20 = input.value._0_8_;
  local_58 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,(Vector *)0x40,(idx_t)input.value._8_8_);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::SHA256State(&local_60);
  lVar2 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar2 = (long)&local_28 + 4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,lVar2,((ulong)this & 0xffffffff) + lVar2);
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::AddString(&local_60,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  out = local_58 + 4;
  if (0xc < (uint)local_58._0_4_) {
    out = (char *)local_58._8_8_;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::FinishHex(&local_60,out);
  uVar1 = (ulong)(uint)local_58._0_4_;
  if (uVar1 < 0xd) {
    switchD_012e3010::default(local_58 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_58._4_4_ = *(undefined4 *)local_58._8_8_;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA256State::~SHA256State(&local_60);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, duckdb_mbedtls::MbedTlsWrapper::SHA256_HASH_LENGTH_TEXT);

		duckdb_mbedtls::MbedTlsWrapper::SHA256State state;
		state.AddString(input.GetString());
		state.FinishHex(hash.GetDataWriteable());

		hash.Finalize();
		return hash;
	}